

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O2

void Gia_IsoAssignOneClass2(Gia_IsoMan_t *p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  int *piVar7;
  word *pwVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  Vec_Int_t *p_00;
  int i;
  long lVar15;
  
  p_00 = p->vClasses;
  iVar9 = p_00->nSize;
  if (iVar9 < 1) {
    __assert_fail("Vec_IntSize(p->vClasses) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                  ,0x204,"void Gia_IsoAssignOneClass2(Gia_IsoMan_t *)");
  }
  iVar10 = -1;
  lVar15 = 0;
  uVar12 = 0;
  uVar11 = 0xffffffff;
  do {
    i = (int)lVar15 + 1;
    if (iVar9 <= i) {
      if ((int)uVar11 < 2) {
        __assert_fail("nSize > 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                      ,0x20a,"void Gia_IsoAssignOneClass2(Gia_IsoMan_t *)");
      }
      uVar13 = p->pStoreW[iVar10] >> 0x20;
      if (p->pUniques[uVar13] != 0) {
        __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                      ,0x21a,"void Gia_IsoAssignOneClass2(Gia_IsoMan_t *)");
      }
      iVar9 = p->nUniques;
      p->nUniques = iVar9 + 1;
      p->pUniques[uVar13] = iVar9;
      uVar1 = p->nSingles;
      uVar4 = p->nEntries;
      p->nSingles = uVar1 + 1;
      p->nEntries = uVar4 + -1;
LAB_005de652:
      for (; lVar14 = (long)p_00->nSize + -2, lVar15 < lVar14; lVar15 = lVar15 + 2) {
        *(undefined8 *)(p_00->pArray + lVar15) = *(undefined8 *)(p_00->pArray + lVar15 + 2);
        uVar12 = uVar12 + 1;
      }
      Vec_IntShrink(p_00,(int)lVar14);
      printf("Broke ties in class %d of size %d at level %d.\n",(ulong)uVar12,(ulong)uVar11,
             (ulong)(uint)p->pLevels[*(uint *)((long)p->pStoreW + (long)iVar10 * 8 + 4)]);
      return;
    }
    iVar10 = Vec_IntEntry(p_00,(int)lVar15);
    uVar11 = Vec_IntEntry(p->vClasses,i);
    if (uVar11 == 2) {
      piVar7 = p->pUniques;
      pwVar8 = p->pStoreW;
      uVar13 = pwVar8[iVar10] >> 0x20;
      if (piVar7[uVar13] != 0) {
        __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                      ,0x20e,"void Gia_IsoAssignOneClass2(Gia_IsoMan_t *)");
      }
      iVar9 = p->nUniques;
      p->nUniques = iVar9 + 1;
      piVar7[uVar13] = iVar9;
      uVar2 = p->nSingles;
      uVar5 = p->nEntries;
      p->nSingles = uVar2 + 1;
      p->nEntries = uVar5 + -1;
      uVar13 = pwVar8[(long)iVar10 + 1] >> 0x20;
      if (piVar7[uVar13] != 0) {
        __assert_fail("p->pUniques[Gia_IsoGetItem(p, iBegin+1)] == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIso.c"
                      ,0x213,"void Gia_IsoAssignOneClass2(Gia_IsoMan_t *)");
      }
      iVar9 = p->nUniques;
      p->nUniques = iVar9 + 1;
      piVar7[uVar13] = iVar9;
      uVar3 = p->nSingles;
      uVar6 = p->nEntries;
      p->nSingles = uVar3 + 1;
      p->nEntries = uVar6 + -1;
      p_00 = p->vClasses;
      uVar11 = 2;
      goto LAB_005de652;
    }
    p_00 = p->vClasses;
    iVar9 = p_00->nSize;
    uVar12 = uVar12 + 1;
    lVar15 = lVar15 + 2;
  } while( true );
}

Assistant:

void Gia_IsoAssignOneClass2( Gia_IsoMan_t * p )
{
    int i, iBegin = -1, nSize = -1;
    // find two variable class
    assert( Vec_IntSize(p->vClasses) > 0 );
    Vec_IntForEachEntryDouble( p->vClasses, iBegin, nSize, i )
    {
        if ( nSize == 2 )
            break;
    }
    assert( nSize > 1 );

    if ( nSize == 2 )
    {
        assert( p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0 );
        p->pUniques[Gia_IsoGetItem(p, iBegin)] = p->nUniques++;
        p->nSingles++;
        p->nEntries--;

        assert( p->pUniques[Gia_IsoGetItem(p, iBegin+1)] == 0 );
        p->pUniques[Gia_IsoGetItem(p, iBegin+1)] = p->nUniques++;
        p->nSingles++;
        p->nEntries--;
    }
    else
    {
        assert( p->pUniques[Gia_IsoGetItem(p, iBegin)] == 0 );
        p->pUniques[Gia_IsoGetItem(p, iBegin)] = p->nUniques++;
        p->nSingles++;
        p->nEntries--;
    }

    for ( ; i < Vec_IntSize(p->vClasses) - 2; i += 2 )
    {
        p->vClasses->pArray[i+0] = p->vClasses->pArray[i+2];
        p->vClasses->pArray[i+1] = p->vClasses->pArray[i+3];
    }
    Vec_IntShrink( p->vClasses, Vec_IntSize(p->vClasses) - 2 );

    printf( "Broke ties in class %d of size %d at level %d.\n", i/2, nSize, p->pLevels[Gia_IsoGetItem(p, iBegin)] );
}